

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testBase32(void)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  size_t size_00;
  StringRef *string;
  char *pcVar6;
  Array<char,_axl::sl::ArrayDetails<char>_> dec_1;
  String enc_1;
  size_t j;
  Rwi rwi;
  size_t size;
  int i;
  Array<char,_axl::sl::ArrayDetails<char>_> source;
  String enc;
  Array<char,_axl::sl::ArrayDetails<char>_> dec;
  char s [81];
  undefined7 in_stack_fffffffffffffe88;
  ValueArg in_stack_fffffffffffffe8f;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_fffffffffffffea0;
  StringRef *in_stack_fffffffffffffea8;
  uint_t flags;
  size_t local_f8;
  Rwi local_f0;
  ulong local_e8;
  int local_dc;
  Array local_d8 [104];
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_70;
  char local_58 [88];
  
  builtin_strncpy(local_58 + 0x40,"OVUSCIJBEE======",0x11);
  builtin_strncpy(local_58 + 0x30,"EBTW65TON4QGSIDI",0x10);
  builtin_strncpy(local_58 + 0x20,"FQQG25LSMF3GK2JM",0x10);
  builtin_strncpy(local_58 + 0x10,"EBUSA3LVOJQXMZLJ",0x10);
  builtin_strncpy(local_58,"NB2WSLBAM5XXM3TP",0x10);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (in_stack_fffffffffffffea0,
             (C *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  axl::enc::Base32Encoding::decode(in_stack_fffffffffffffea8);
  flags = (uint_t)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x113145);
  axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::append
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe8f,0x113159);
  pcVar5 = axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::cp(&local_70);
  printf("decoded: %s\n",pcVar5);
  pcVar5 = axl::sl::Array::operator_cast_to_char_((Array *)&local_70);
  size_00 = axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(&local_70);
  axl::enc::Base32Encoding::encode(pcVar5,size_00,flags);
  string = (StringRef *)
           axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                     (in_stack_fffffffffffffe90);
  printf("encoded: %s\n",string);
  printf("orginal: %s\n",local_58);
  axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x113218);
  for (local_dc = 0; local_dc < 500; local_dc = local_dc + 1) {
    uVar2 = rand();
    uVar3 = uVar2;
    if ((int)uVar2 < 0) {
      uVar3 = uVar2 + 0x3f;
    }
    local_e8 = (ulong)(int)((uVar2 + 0x10) - (uVar3 & 0xffffffc0));
    axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::setCount
              ((Array<char,_axl::sl::ArrayDetails<char>_> *)in_stack_fffffffffffffe90,
               CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::Rwi::Rwi
              ((Rwi *)in_stack_fffffffffffffe90,
               (Array<char,_axl::sl::ArrayDetails<char>_> *)
               CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    for (local_f8 = 0; local_f8 < local_e8; local_f8 = local_f8 + 1) {
      iVar4 = rand();
      cVar1 = (char)iVar4;
      pcVar6 = axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::Rwi::operator[]
                         (&local_f0,local_f8);
      *pcVar6 = cVar1;
    }
    in_stack_fffffffffffffe90 =
         (StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
         axl::sl::Array::operator_cast_to_char_(local_d8);
    axl::enc::Base32Encoding::encode(pcVar5,size_00,(uint_t)((ulong)string >> 0x20));
    axl::enc::Base32Encoding::decode(string);
    axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::~Array
              ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x1133b1);
    axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x1133bb);
  }
  axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::~Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x1133fe);
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x11340b);
  axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::~Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x113418);
  return;
}

Assistant:

void
testBase32() {
	char s[] = "NB2WSLBAM5XXM3TPEBUSA3LVOJQXMZLJFQQG25LSMF3GK2JMEBTW65TON4QGSIDIOVUSCIJBEE======";

	sl::Array<char> dec = enc::Base32Encoding::decode(s);
	dec.append(0);
	printf("decoded: %s\n", dec.cp());

	sl::String enc = enc::Base32Encoding::encode(dec, dec.getCount() - 1);
	printf("encoded: %s\n", enc.sz());
	printf("orginal: %s\n", s);
	ASSERT(enc == s);

	sl::Array<char> source;


	for (int i = 0; i < 500; i++) {
		size_t size = rand() % 64 + 16;
		source.setCount(size);
		sl::Array<char>::Rwi rwi = source;

		for (size_t j = 0; j < size; j++)
			rwi[j] = (char)rand();

		sl::String enc = enc::Base32Encoding::encode(source, size);
		sl::Array<char> dec = enc::Base32Encoding::decode(enc);
		ASSERT(dec.getCount() == size && memcmp(dec, source, size) == 0);
	}
}